

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.h
# Opt level: O2

void __thiscall
Assimp::MDL::HalfLife::HL1MDLLoader::
load_file_into_buffer<Assimp::MDL::HalfLife::SequenceHeader_HL1>
          (HL1MDLLoader *this,string *file_path,uchar **buffer)

{
  IOSystem *pIVar1;
  int iVar2;
  long *plVar3;
  ulong uVar4;
  uchar *puVar5;
  DeadlyImportError *pDVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  undefined4 extraout_var;
  
  iVar2 = (*this->io_->_vptr_IOSystem[2])(this->io_,(file_path->_M_dataplus)._M_p);
  if ((char)iVar2 == '\0') {
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DefaultIOSystem::fileName(&local_40,file_path);
    std::operator+(&local_60,"Missing file ",&local_40);
    std::operator+(&local_80,&local_60,".");
    DeadlyImportError::DeadlyImportError(pDVar6,&local_80);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pIVar1 = this->io_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"rb",(allocator<char> *)&local_60);
  iVar2 = (*pIVar1->_vptr_IOSystem[4])
                    (pIVar1,(file_path->_M_dataplus)._M_p,local_80._M_dataplus._M_p);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  std::__cxx11::string::~string((string *)&local_80);
  if (plVar3 != (long *)0x0) {
    uVar4 = (**(code **)(*plVar3 + 0x30))(plVar3);
    if (0x4b < uVar4) {
      puVar5 = (uchar *)operator_new__(uVar4 + 1);
      *buffer = puVar5;
      (**(code **)(*plVar3 + 0x10))(plVar3,puVar5,1,uVar4);
      (*buffer)[uVar4] = '\0';
      (**(code **)(*plVar3 + 8))(plVar3);
      return;
    }
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"MDL file is too small.",(allocator<char> *)&local_60);
    DeadlyImportError::DeadlyImportError(pDVar6,&local_80);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DefaultIOSystem::fileName(&local_40,file_path);
  std::operator+(&local_60,"Failed to open MDL file ",&local_40);
  std::operator+(&local_80,&local_60,".");
  DeadlyImportError::DeadlyImportError(pDVar6,&local_80);
  __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void HL1MDLLoader::load_file_into_buffer(const std::string &file_path, unsigned char *&buffer) {
    if (!io_->Exists(file_path))
        throw DeadlyImportError("Missing file " + DefaultIOSystem::fileName(file_path) + ".");

    std::unique_ptr<IOStream> file(io_->Open(file_path));

    if (file.get() == NULL)
        throw DeadlyImportError("Failed to open MDL file " + DefaultIOSystem::fileName(file_path) + ".");

    const size_t file_size = file->FileSize();
    if (file_size < sizeof(MDLFileHeader))
        throw DeadlyImportError("MDL file is too small.");

    buffer = new unsigned char[1 + file_size];
    file->Read((void *)buffer, 1, file_size);
    buffer[file_size] = '\0';
}